

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void StoreTrivialContextMap
               (EncodeContextMapArena *arena,size_t num_types,size_t context_bits,HuffmanTree *tree,
               size_t *storage_ix,uint8_t *storage)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong histogram_length;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar1 = context_bits - 1;
    histogram_length = (context_bits + num_types) - 1;
    memset(arena,0,histogram_length * 4);
    uVar7 = *storage_ix;
    *(ulong *)(storage + (uVar7 >> 3)) = (ulong)storage[uVar7 >> 3] | 1L << ((byte)uVar7 & 7);
    uVar8 = uVar7 + 1;
    *storage_ix = uVar8;
    *(size_t *)(storage + (uVar8 >> 3)) =
         context_bits - 2 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
    *storage_ix = uVar7 + 5;
    arena->histogram[context_bits - 1] = (uint32_t)num_types;
    arena->histogram[0] = 1;
    auVar4 = _DAT_003bd390;
    auVar3 = _DAT_003bd380;
    auVar2 = _DAT_003bd370;
    if (context_bits < histogram_length) {
      lVar5 = num_types - 2;
      auVar9._8_4_ = (int)lVar5;
      auVar9._0_8_ = lVar5;
      auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar8 = 0;
      auVar9 = auVar9 ^ _DAT_003bd390;
      do {
        auVar11._8_4_ = (int)uVar8;
        auVar11._0_8_ = uVar8;
        auVar11._12_4_ = (int)(uVar8 >> 0x20);
        auVar12 = (auVar11 | auVar3) ^ auVar4;
        iVar10 = auVar9._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ ||
                    iVar10 < auVar12._4_4_) & 1)) {
          arena->histogram[context_bits + uVar8] = 1;
        }
        if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
            auVar12._12_4_ <= auVar9._12_4_) {
          arena->histogram[context_bits + uVar8 + 1] = 1;
        }
        auVar11 = (auVar11 | auVar2) ^ auVar4;
        iVar13 = auVar11._4_4_;
        if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
          arena->histogram[context_bits + uVar8 + 2] = 1;
          arena->histogram[context_bits + uVar8 + 3] = 1;
        }
        uVar8 = uVar8 + 4;
      } while ((num_types + 2 & 0xfffffffffffffffc) != uVar8);
    }
    BuildAndStoreHuffmanTree
              (arena->histogram,histogram_length,histogram_length,tree,arena->depths,arena->bits,
               storage_ix,storage);
    lVar5 = 0;
    do {
      lVar6 = lVar5 + lVar1;
      if (lVar5 == 0) {
        lVar6 = 0;
      }
      uVar8 = *storage_ix;
      uVar7 = arena->depths[lVar6] + uVar8;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)arena->bits[lVar6] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      *storage_ix = uVar7;
      uVar8 = arena->depths[context_bits - 1] + uVar7;
      *(ulong *)(storage + (uVar7 >> 3)) =
           (ulong)arena->bits[context_bits - 1] << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
      *storage_ix = uVar8;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)(uint)~(-1 << ((byte)lVar1 & 0x1f)) << ((byte)uVar8 & 7) |
           (ulong)storage[uVar8 >> 3];
      *storage_ix = uVar8 + lVar1;
      lVar5 = lVar5 + 1;
    } while (num_types + (num_types == 0) != lVar5);
    uVar8 = *storage_ix;
    *(ulong *)(storage + (uVar8 >> 3)) = (ulong)storage[uVar8 >> 3] | 1L << ((byte)uVar8 & 7);
    *storage_ix = uVar8 + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(EncodeContextMapArena* arena,
                                   size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
    uint8_t* BROTLI_RESTRICT const depths = arena->depths;
    uint16_t* BROTLI_RESTRICT const bits = arena->bits;
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, alphabet_size,
                             tree, depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}